

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O2

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_pow>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float *pfVar1;
  undefined1 (*pauVar2) [16];
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  float fVar11;
  __m256 afVar12;
  undefined1 auVar14 [56];
  undefined1 auVar13 [64];
  __m128 afVar15;
  binary_op_pow op;
  __m256 _p1;
  __m256 _p;
  binary_op_pow local_dd;
  int local_dc;
  void *local_d8;
  undefined8 local_d0;
  Mat *local_c8;
  ulong local_c0;
  Mat *local_b8;
  Mat *local_b0;
  ulong local_a8;
  __m256 local_a0;
  float local_80 [2];
  float afStack_78 [2];
  float afStack_70 [2];
  float afStack_68 [14];
  
  uVar3 = a->c;
  local_dc = a->h * a->w * a->d * a->elempack;
  local_b8 = a;
  local_b0 = b;
  Mat::create_like(c,a,opt->blob_allocator);
  local_d0 = 0xffffffffffffff9c;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    local_d0 = 0;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    local_c0 = (ulong)uVar3;
    local_c8 = c;
    for (local_a8 = 0; local_a8 != local_c0; local_a8 = local_a8 + 1) {
      local_d8 = (void *)(local_b8->elemsize * local_b8->cstep * local_a8 + (long)local_b8->data);
      lVar8 = local_b0->elemsize * local_b0->cstep * local_a8;
      pvVar4 = local_b0->data;
      lVar7 = c->elemsize * c->cstep * local_a8;
      pvVar5 = c->data;
      lVar9 = 0;
      lVar6 = 0;
      for (iVar10 = 0; iVar10 + 7 < local_dc; iVar10 = iVar10 + 8) {
        pfVar1 = (float *)((long)local_d8 + lVar6);
        local_80 = *(float (*) [2])pfVar1;
        afStack_78 = *(float (*) [2])(pfVar1 + 2);
        afStack_70 = *(float (*) [2])(pfVar1 + 4);
        afStack_68._0_8_ = *(undefined8 *)(pfVar1 + 6);
        local_a0 = *(__m256 *)((long)pvVar4 + lVar6 + lVar8);
        afVar12 = local_a0;
        BinaryOp_x86_avx_functor::binary_op_pow::func_pack8(&local_dd,(__m256 *)local_80,&local_a0);
        *(__m256 *)((long)pvVar5 + lVar6 + lVar7) = afVar12;
        lVar6 = lVar6 + 0x20;
        lVar9 = lVar9 + 8;
      }
      for (; c = local_c8, iVar10 + 3 < local_dc; iVar10 = iVar10 + 4) {
        local_80 = *(float (*) [2])((long)local_d8 + lVar6);
        afStack_78 = *(float (*) [2])((float *)((long)local_d8 + lVar6) + 2);
        pauVar2 = (undefined1 (*) [16])((long)pvVar4 + lVar6 + lVar8);
        local_a0._0_16_ = *pauVar2;
        auVar14 = ZEXT856(*(ulong *)(*pauVar2 + 8));
        afVar15 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                            (&local_dd,(__m128 *)local_80,(__m128 *)local_a0);
        auVar13._0_8_ = afVar15._0_8_;
        auVar13._8_56_ = auVar14;
        *(undefined1 (*) [16])((long)pvVar5 + lVar6 + lVar7) = auVar13._0_16_;
        lVar6 = lVar6 + 0x10;
        lVar9 = lVar9 + 4;
      }
      for (; (int)lVar9 < local_dc; lVar9 = lVar9 + 1) {
        fVar11 = powf(*(float *)((long)local_d8 + lVar9 * 4),
                      *(float *)((long)pvVar4 + lVar9 * 4 + lVar8));
        *(float *)((long)pvVar5 + lVar9 * 4 + lVar7) = fVar11;
      }
    }
  }
  return (int)local_d0;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}